

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int ffselect_table(fitsfile **fptr,char *outfile,char *expr,int *status)

{
  FITSfile *pFVar1;
  int iVar2;
  int iVar3;
  fitsfile *outfptr;
  int hdunum;
  fitsfile *newptr;
  int local_3c;
  fitsfile *local_38;
  
  if (*outfile == '\0') {
    local_38 = *fptr;
LAB_0012012b:
    outfptr = local_38;
    iVar3 = ffsrow(*fptr,local_38,expr,status);
    iVar2 = local_3c;
    if (iVar3 < 1) {
      if (*outfile == '\0') goto LAB_001202ca;
      if ((*fptr)->Fptr->only_one == 0) {
        iVar3 = ffmahd(*fptr,local_3c + 1,(int *)0x0,status);
        if (iVar3 < 1) {
          iVar2 = iVar2 + 2;
          do {
            ffcopy(*fptr,outfptr,0,status);
            iVar3 = ffmahd(*fptr,iVar2,(int *)0x0,status);
            iVar2 = iVar2 + 1;
          } while (iVar3 < 1);
        }
        if (*status == 0x6b) {
          *status = 0;
        }
        else if (0 < *status) goto LAB_001202bf;
      }
      else {
        local_3c = 2;
      }
      ffclos(*fptr,status);
      *fptr = outfptr;
      ffmahd(outfptr,local_3c,(int *)0x0,status);
      goto LAB_001202ca;
    }
    if (*outfile == '\0') goto LAB_001202ca;
  }
  else {
    iVar2 = ffinit(&local_38,outfile,status);
    if (0 < iVar2) {
      ffpmsg("failed to create file for selected rows from input table");
      ffpmsg(outfile);
      goto LAB_001202ca;
    }
    ffghdn(*fptr,&local_3c);
    outfptr = local_38;
    if ((*fptr)->Fptr->only_one == 0) {
      if (1 < local_3c) {
        iVar2 = 1;
        do {
          ffmahd(*fptr,iVar2,(int *)0x0,status);
          iVar3 = ffcopy(*fptr,outfptr,0,status);
          if (0 < iVar3) goto LAB_001202bf;
          iVar2 = iVar2 + 1;
        } while (iVar2 < local_3c);
      }
LAB_00120203:
      ffmahd(*fptr,local_3c,(int *)0x0,status);
      outfptr = local_38;
      iVar2 = ffcphd(*fptr,local_38,status);
      if (iVar2 < 1) {
        ffmkyj(outfptr,"NAXIS2",0,(char *)0x0,status);
        pFVar1 = outfptr->Fptr;
        pFVar1->origrows = 0;
        pFVar1->numrows = 0;
        iVar2 = ffrdef(outfptr,status);
        if (iVar2 < 1) goto LAB_0012012b;
      }
    }
    else {
      ffmahd(*fptr,1,(int *)0x0,status);
      outfptr = local_38;
      iVar2 = ffcopy(*fptr,local_38,0,status);
      if (iVar2 < 1) goto LAB_00120203;
    }
  }
LAB_001202bf:
  ffclos(outfptr,status);
LAB_001202ca:
  return *status;
}

Assistant:

int ffselect_table(
           fitsfile **fptr,  /* IO - pointer to input table; on output it  */
                             /*      points to the new selected rows table */
           char *outfile,    /* I - name for output file */
           char *expr,       /* I - Boolean expression    */
           int *status)
{
    fitsfile *newptr;
    int ii, hdunum;

    if (*outfile)
    {
      /* create new empty file in to hold the selected rows */
      if (ffinit(&newptr, outfile, status) > 0)
      {
        ffpmsg(
         "failed to create file for selected rows from input table");
        ffpmsg(outfile);
        return(*status);
      }

      fits_get_hdu_num(*fptr, &hdunum);  /* current HDU number in input file */

      /* copy all preceding extensions to the output file, if the 'only_one' flag is not set */
      if (!((*fptr)->Fptr)->only_one) {
        for (ii = 1; ii < hdunum; ii++)
        {
          fits_movabs_hdu(*fptr, ii, NULL, status);
          if (fits_copy_hdu(*fptr, newptr, 0, status) > 0)
          {
            ffclos(newptr, status);
            return(*status);
          }
        }
      } else {
          /* just copy the primary array */
          fits_movabs_hdu(*fptr, 1, NULL, status);
          if (fits_copy_hdu(*fptr, newptr, 0, status) > 0)
          {
            ffclos(newptr, status);
            return(*status);
          }
      }
      
      fits_movabs_hdu(*fptr, hdunum, NULL, status);

      /* copy all the header keywords from the input to output file */
      if (fits_copy_header(*fptr, newptr, status) > 0)
      {
        ffclos(newptr, status);
        return(*status);
      }

      /* set number of rows = 0 */
      fits_modify_key_lng(newptr, "NAXIS2", 0, NULL,status);
      (newptr->Fptr)->numrows = 0;
      (newptr->Fptr)->origrows = 0;

      if (ffrdef(newptr, status) > 0)  /* force the header to be scanned */
      {
        ffclos(newptr, status);
        return(*status);
      }
    }
    else
        newptr = *fptr;  /* will delete rows in place in the table */

    /* copy rows which satisfy the selection expression to the output table */
    /* or delete the nonqualifying rows if *fptr = newptr.   */
    if (fits_select_rows(*fptr, newptr, expr, status) > 0)
    {
        if (*outfile)
            ffclos(newptr, status);

        return(*status);
    }

    if (*outfile)
    {
      /* copy any remaining HDUs to the output copy */

      if (!((*fptr)->Fptr)->only_one) {
        for (ii = hdunum + 1; 1; ii++)
        {
          if (fits_movabs_hdu(*fptr, ii, NULL, status) > 0)
            break;

          fits_copy_hdu(*fptr, newptr, 0, status);
        }

        if (*status == END_OF_FILE)   
          *status = 0;              /* got the expected EOF error; reset = 0  */
        else if (*status > 0)
        {
          ffclos(newptr, status);
          return(*status);
        }
      } else {
        hdunum = 2;
      }

      /* close the original file and return ptr to the new image */
      ffclos(*fptr, status);

      *fptr = newptr; /* reset the pointer to the new table */

      /* move back to the selected table HDU */
      fits_movabs_hdu(*fptr, hdunum, NULL, status);
    }

    return(*status);
}